

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry.cpp
# Opt level: O0

AuditEvent * __thiscall license::EventRegistry::getLastFailure(EventRegistry *this)

{
  bool bVar1;
  size_type sVar2;
  pointer pAVar3;
  __normal_iterator<const_AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_>
  local_30;
  __normal_iterator<const_AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_>
  local_28;
  const_iterator it;
  AuditEvent *result;
  EventRegistry *this_local;
  
  it._M_current = (AuditEvent *)0x0;
  sVar2 = std::vector<AuditEvent,_std::allocator<AuditEvent>_>::size(&this->logs);
  if (sVar2 == 0) {
    this_local = (EventRegistry *)it._M_current;
  }
  else {
    local_28._M_current =
         (AuditEvent *)std::vector<AuditEvent,_std::allocator<AuditEvent>_>::end(&this->logs);
    do {
      __gnu_cxx::
      __normal_iterator<const_AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_>::
      operator--(&local_28);
      pAVar3 = __gnu_cxx::
               __normal_iterator<const_AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_>
               ::operator->(&local_28);
      if (pAVar3->severity == SVRT_ERROR) {
        it._M_current =
             __gnu_cxx::
             __normal_iterator<const_AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_>
             ::operator*(&local_28);
        break;
      }
      local_30._M_current =
           (AuditEvent *)std::vector<AuditEvent,_std::allocator<AuditEvent>_>::begin(&this->logs);
      bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    } while (bVar1);
    this_local = (EventRegistry *)it._M_current;
  }
  return (AuditEvent *)this_local;
}

Assistant:

AuditEvent const * EventRegistry::getLastFailure() const {
	const AuditEvent* result = NULL;
	if (logs.size() == 0) {
		return result;
	}
	auto it = logs.end();
	do {
		--it;
		if (it->severity == SVRT_ERROR) {
			result = &(*it);
			break;
		}
	} while (it != logs.begin());
	return result;

}